

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Any.hh
# Opt level: O1

Any * __thiscall Any::operator=(Any *this,Any *a)

{
  _Head_base<0UL,_Any::Base__*,_false> _Var1;
  _Head_base<0UL,_Any::Base__*,_false> _Var2;
  Base_ *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Any::Base__*,_false> local_18;
  
  _Var1._M_head_impl =
       (a->ptr_)._M_t.super___uniq_ptr_impl<Any::Base_,_std::default_delete<Any::Base_>_>._M_t.
       super__Tuple_impl<0UL,_Any::Base__*,_std::default_delete<Any::Base_>_>.
       super__Head_base<0UL,_Any::Base__*,_false>._M_head_impl;
  if ((this->ptr_)._M_t.super___uniq_ptr_impl<Any::Base_,_std::default_delete<Any::Base_>_>._M_t.
      super__Tuple_impl<0UL,_Any::Base__*,_std::default_delete<Any::Base_>_>.
      super__Head_base<0UL,_Any::Base__*,_false>._M_head_impl != _Var1._M_head_impl) {
    if (_Var1._M_head_impl == (Base_ *)0x0) {
      local_18._M_head_impl = (Base_ *)0x0;
    }
    else {
      local_18._M_head_impl = in_RAX;
      (*(_Var1._M_head_impl)->_vptr_Base_[2])(&local_18);
    }
    _Var2._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (Base_ *)0x0;
    _Var1._M_head_impl =
         (this->ptr_)._M_t.super___uniq_ptr_impl<Any::Base_,_std::default_delete<Any::Base_>_>._M_t.
         super__Tuple_impl<0UL,_Any::Base__*,_std::default_delete<Any::Base_>_>.
         super__Head_base<0UL,_Any::Base__*,_false>._M_head_impl;
    (this->ptr_)._M_t.super___uniq_ptr_impl<Any::Base_,_std::default_delete<Any::Base_>_>._M_t.
    super__Tuple_impl<0UL,_Any::Base__*,_std::default_delete<Any::Base_>_>.
    super__Head_base<0UL,_Any::Base__*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (Base_ *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_Base_[1])();
    }
    if (local_18._M_head_impl != (Base_ *)0x0) {
      (*(local_18._M_head_impl)->_vptr_Base_[1])();
    }
    (this->tp_index_)._M_target = (a->tp_index_)._M_target;
  }
  return this;
}

Assistant:

Any& operator=(const Any& a)
	{
		if (ptr_ == a.ptr_)
			return *this;

		ptr_ = a.clone();
		tp_index_ = a.tp_index_;
		return *this;
	}